

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.c
# Opt level: O3

int mbedtls_oid_get_numeric_string(char *buf,size_t size,mbedtls_asn1_buf *oid)

{
  ulong uVar1;
  uint uVar2;
  size_t __maxlen;
  ulong uVar3;
  char *__s;
  bool bVar4;
  
  __maxlen = size;
  if (oid->len != 0) {
    uVar2 = *oid->p / 0x28;
    uVar2 = snprintf(buf,size,"%d.%d",(ulong)uVar2,(ulong)(byte)(*oid->p + (char)uVar2 * -0x28));
    if ((int)uVar2 < 0) {
      return -0xb;
    }
    uVar3 = (ulong)uVar2;
    __maxlen = size - uVar3;
    if (size < uVar3 || __maxlen == 0) {
      return -0xb;
    }
    uVar1 = oid->len;
    if (1 < uVar1) {
      __s = buf + uVar3;
      uVar3 = 1;
      uVar2 = 0;
      do {
        if (0x1ffffff < uVar2) {
          return -0xb;
        }
        uVar2 = oid->p[uVar3] & 0x7f | uVar2 << 7;
        if (-1 < (char)oid->p[uVar3]) {
          uVar2 = snprintf(__s,__maxlen,".%d");
          if ((int)uVar2 < 0) {
            return -0xb;
          }
          uVar1 = (ulong)uVar2;
          bVar4 = __maxlen < uVar1;
          __maxlen = __maxlen - uVar1;
          if (bVar4 || __maxlen == 0) {
            return -0xb;
          }
          __s = __s + uVar1;
          uVar1 = oid->len;
          uVar2 = 0;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar1);
    }
  }
  return (int)size - (int)__maxlen;
}

Assistant:

int mbedtls_oid_get_numeric_string( char *buf, size_t size,
                            const mbedtls_asn1_buf *oid )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, n;
    unsigned int value;
    char *p;

    p = buf;
    n = size;

    /* First byte contains first two dots */
    if( oid->len > 0 )
    {
        ret = mbedtls_snprintf( p, n, "%d.%d", oid->p[0] / 40, oid->p[0] % 40 );
        OID_SAFE_SNPRINTF;
    }

    value = 0;
    for( i = 1; i < oid->len; i++ )
    {
        /* Prevent overflow in value. */
        if( ( ( value << 7 ) >> 7 ) != value )
            return( MBEDTLS_ERR_OID_BUF_TOO_SMALL );

        value <<= 7;
        value += oid->p[i] & 0x7F;

        if( !( oid->p[i] & 0x80 ) )
        {
            /* Last byte */
            ret = mbedtls_snprintf( p, n, ".%d", value );
            OID_SAFE_SNPRINTF;
            value = 0;
        }
    }

    return( (int) ( size - n ) );
}